

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O3

int __thiscall
aeron::Image::
controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Image *this,
          function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  length_t lVar1;
  int iVar2;
  index_t index;
  ControlledPollAction CVar3;
  uint uVar4;
  uint index_00;
  ulong uVar5;
  int iVar6;
  AtomicBuffer *this_00;
  long lVar7;
  uint local_6c;
  ulong local_60;
  int local_50;
  int local_4c;
  AtomicBuffer *local_48;
  Header *local_40;
  _Any_data *local_38;
  
  iVar6 = 0;
  if (((this->m_isClosed)._M_base._M_i & 1U) == 0) {
    local_48 = (AtomicBuffer *)&this->m_subscriberPosition;
    iVar6 = (this->m_subscriberPosition).
            super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_offset;
    local_38 = (_Any_data *)fragmentHandler;
    concurrent::AtomicBuffer::boundsCheck(local_48,iVar6,8);
    local_60 = *(ulong *)((this->m_subscriberPosition).
                          super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.
                          m_impl.m_buffer.m_buffer + iVar6);
    uVar5 = (local_60 >> ((byte)this->m_positionBitsToShift & 0x3f)) % 3;
    local_6c = this->m_termLengthMask & (uint)local_60;
    lVar1 = (this->m_termBuffers)._M_elems[uVar5].m_length;
    (this->m_header).m_buffer.m_buffer = (this->m_termBuffers)._M_elems[uVar5].m_buffer;
    (this->m_header).m_buffer.m_length = lVar1;
    index_00 = local_6c;
    iVar6 = 0;
    if ((0 < fragmentLimit) && (iVar6 = 0, (int)local_6c < (int)lVar1)) {
      this_00 = (this->m_termBuffers)._M_elems + uVar5;
      local_40 = &this->m_header;
      iVar6 = 0;
      while( true ) {
        concurrent::AtomicBuffer::boundsCheck(this_00,index_00,4);
        iVar2 = *(int *)((this->m_termBuffers)._M_elems[uVar5].m_buffer + (int)index_00);
        if (iVar2 < 1) break;
        uVar4 = (iVar2 + 0x1fU & 0xffffffe0) + index_00;
        lVar7 = (long)(int)index_00 + 6;
        concurrent::AtomicBuffer::boundsCheck(this_00,(index_t)lVar7,2);
        if (*(short *)((this->m_termBuffers)._M_elems[uVar5].m_buffer + lVar7) != 0) {
          (this->m_header).m_offset = index_00;
          local_4c = index_00 + 0x20;
          local_50 = iVar2 + -0x20;
          if (*(long *)(local_38 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          CVar3 = (**(code **)(local_38->_M_pod_data + 0x18))
                            (local_38,this_00,&local_4c,&local_50,local_40);
          if (CVar3 == ABORT) break;
          iVar6 = iVar6 + 1;
          if (CVar3 == COMMIT) {
            local_60 = local_60 + (long)(int)(uVar4 - local_6c);
            index = (this->m_subscriberPosition).
                    super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
                    m_offset;
            concurrent::AtomicBuffer::boundsCheck(local_48,index,8);
            *(ulong *)((this->m_subscriberPosition).
                       super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.
                       m_impl.m_buffer.m_buffer + index) = local_60;
            local_6c = uVar4;
          }
          else {
            index_00 = uVar4;
            if (CVar3 == BREAK) break;
          }
        }
        index_00 = uVar4;
        if ((fragmentLimit <= iVar6) || ((int)lVar1 <= (int)uVar4)) break;
      }
    }
    if (index_00 - local_6c != 0 && (int)local_6c <= (int)index_00) {
      iVar2 = (this->m_subscriberPosition).
              super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
              m_offset;
      concurrent::AtomicBuffer::boundsCheck(local_48,iVar2,8);
      *(ulong *)((this->m_subscriberPosition).
                 super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
                 m_buffer.m_buffer + iVar2) = local_60 + (index_00 - local_6c);
    }
  }
  return iVar6;
}

Assistant:

inline int controlledPoll(F&& fragmentHandler, int fragmentLimit)
    {
        int result = 0;

        if (!isClosed())
        {
            int fragmentsRead = 0;
            std::int64_t initialPosition = m_subscriberPosition.get();
            std::int32_t initialOffset = (std::int32_t) initialPosition & m_termLengthMask;
            const int index = LogBufferDescriptor::indexByPosition(initialPosition, m_positionBitsToShift);
            assert(index >= 0 && index < LogBufferDescriptor::PARTITION_COUNT);
            AtomicBuffer &termBuffer = m_termBuffers[index];
            std::int32_t resultingOffset = initialOffset;
            const util::index_t capacity = termBuffer.capacity();

            m_header.buffer(termBuffer);

            try
            {
                while (fragmentsRead < fragmentLimit && resultingOffset < capacity)
                {
                    const std::int32_t length = FrameDescriptor::frameLengthVolatile(termBuffer, resultingOffset);
                    if (length <= 0)
                    {
                        break;
                    }

                    const std::int32_t frameOffset = resultingOffset;
                    const std::int32_t alignedLength = util::BitUtil::align(length, FrameDescriptor::FRAME_ALIGNMENT);
                    resultingOffset += alignedLength;

                    if (FrameDescriptor::isPaddingFrame(termBuffer, frameOffset))
                    {
                        continue;
                    }

                    m_header.offset(frameOffset);

                    const ControlledPollAction action = fragmentHandler(
                        termBuffer,
                        frameOffset + DataFrameHeader::LENGTH,
                        length - DataFrameHeader::LENGTH,
                        m_header);

                    if (ControlledPollAction::ABORT == action)
                    {
                        resultingOffset -= alignedLength;
                        break;
                    }

                    ++fragmentsRead;

                    if (ControlledPollAction::BREAK == action)
                    {
                        break;
                    }
                    else if (ControlledPollAction::COMMIT == action)
                    {
                        initialPosition += (resultingOffset - initialOffset);
                        initialOffset = resultingOffset;
                        m_subscriberPosition.setOrdered(initialPosition);
                    }
                }
            }
            catch (const std::exception& ex)
            {
                m_exceptionHandler(ex);
            }

            const std::int64_t resultingPosition = initialPosition + (resultingOffset - initialOffset);
            if (resultingPosition > initialPosition)
            {
                m_subscriberPosition.setOrdered(resultingPosition);
            }

            result = fragmentsRead;
        }

        return result;
    }